

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<4U>_>::Exec
          (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<4U>_> *this,Matcher *matcher
          ,Char *input,CharCount inputLength,CharCount *matchStart,CharCount *inputOffset,
          CharCount *nextSyncInputOffset,uint8 **instPointer,ContStack *contStack,
          AssertionStack *assertionStack,uint *qcTicks,bool firstIteration)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Program *pPVar4;
  uint uVar5;
  CharCount CVar6;
  uint uVar7;
  Type patLen;
  
  uVar5 = (this->super_BackupMixin).backup.lower;
  CVar6 = *matchStart;
  if (inputLength - CVar6 < uVar5) {
LAB_00ef12f4:
    *matchStart = inputLength;
    bVar2 = true;
  }
  else {
    if (*inputOffset < *nextSyncInputOffset) {
      *instPointer = *instPointer + 0x451;
    }
    else {
      if (*inputOffset - CVar6 < uVar5) {
        *inputOffset = CVar6 + uVar5;
      }
      uVar5 = (this->super_EquivScannerMixinT<4U>).super_ScannerMixin.super_LiteralMixin.offset;
      patLen = (this->super_EquivScannerMixinT<4U>).super_ScannerMixin.super_LiteralMixin.length;
      pPVar4 = (matcher->program).ptr;
      if ((pPVar4->rep).insts.litbufLen - uVar5 < patLen * 4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                           ,0x2ae,
                           "(length * CaseInsensitive::EquivClassSize <= matcher.program->rep.insts.litbufLen - offset)"
                           ,
                           "length * CaseInsensitive::EquivClassSize <= matcher.program->rep.insts.litbufLen - offset"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
        pPVar4 = (matcher->program).ptr;
        uVar5 = (this->super_EquivScannerMixinT<4U>).super_ScannerMixin.super_LiteralMixin.offset;
        patLen = (this->super_EquivScannerMixinT<4U>).super_ScannerMixin.super_LiteralMixin.length;
      }
      bVar2 = TextbookBoyerMoore<char16_t>::Match<4u,4u>
                        (&(this->super_EquivScannerMixinT<4U>).super_ScannerMixin.scanner,input,
                         inputLength,inputOffset,(pPVar4->rep).insts.litbuf.ptr + uVar5,patLen,
                         matcher->stats);
      if (!bVar2) goto LAB_00ef12f4;
      *nextSyncInputOffset = *inputOffset + 1;
      uVar5 = (this->super_BackupMixin).backup.upper;
      CVar6 = *matchStart;
      if (uVar5 != 0xffffffff) {
        uVar7 = *inputOffset - CVar6;
        if (uVar5 <= uVar7) {
          uVar7 = uVar5;
        }
        CVar6 = *inputOffset - uVar7;
        *matchStart = CVar6;
      }
      *inputOffset = CVar6;
      *instPointer = *instPointer + 0x451;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

inline bool SyncToLiteralAndBackupInstT<ScannerT>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        if (backup.lower > inputLength - matchStart)
        {
            // Even match at very end doesn't allow for minimum backup
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        if(inputOffset < nextSyncInputOffset)
        {
            // We have not yet reached the offset in the input we last synced to before backing up, so it's unnecessary to sync
            // again since we'll sync to the same point in the input and back up to the same place we are at now
            instPointer += sizeof(*this);
            return false;
        }

        if (backup.lower > inputOffset - matchStart)
        {
            // No use looking for match until minimum backup is possible
            inputOffset = matchStart + backup.lower;
        }

        if (!this->Match(matcher, input, inputLength, inputOffset))
        {
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        nextSyncInputOffset = inputOffset + 1;

        if (backup.upper != CharCountFlag)
        {
            // Set new start at most backup.upper from start of literal
            CharCount maxBackup = inputOffset - matchStart;
            matchStart = inputOffset - min(maxBackup, (CharCount)backup.upper);
        }
        // else: leave start where it is

        // Move input to new match start
        inputOffset = matchStart;

        instPointer += sizeof(*this);
        return false;
    }